

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::EnumerateObjects
          (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction)

{
  undefined6 in_register_00000032;
  _func_void_void_ptr_size_t *in_R8;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this_00;
  anon_class_16_2_d31750c2 fn;
  anon_class_16_2_d31750c2 fn_00;
  
  this_00 = &this->allocatorHead;
  do {
    SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
    UpdateHeapBlock(this_00);
    this_00 = this_00->next;
  } while (this_00 != &this->allocatorHead);
  fn.CallBackFunction = in_R8;
  fn._0_8_ = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->fullBlockList,
             (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)
             (CONCAT62(in_register_00000032,infoBits) & 0xffffffff),fn);
  fn_00.CallBackFunction = in_R8;
  fn_00._0_8_ = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->heapBlockList,
             (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)
             (CONCAT62(in_register_00000032,infoBits) & 0xffffffff),fn_00);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    UpdateAllocators();
    HeapBucket::EnumerateObjects(fullBlockList, infoBits, CallBackFunction);
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBucket::EnumerateObjects(sweepableHeapBlockList, infoBits, CallBackFunction);
    }
#endif
    HeapBucket::EnumerateObjects(heapBlockList, infoBits, CallBackFunction);
}